

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

MockNamedValue * __thiscall
MockNamedValueList::getValueByName(MockNamedValueList *this,SimpleString *name)

{
  bool bVar1;
  MockNamedValue *pMVar2;
  SimpleString local_38;
  MockNamedValueListNode *local_28;
  MockNamedValueListNode *p;
  SimpleString *name_local;
  MockNamedValueList *this_local;
  
  local_28 = this->head_;
  p = (MockNamedValueListNode *)name;
  name_local = (SimpleString *)this;
  while( true ) {
    if (local_28 == (MockNamedValueListNode *)0x0) {
      return (MockNamedValue *)0x0;
    }
    MockNamedValueListNode::getName((MockNamedValueListNode *)&local_38);
    bVar1 = operator==(&local_38,(SimpleString *)p);
    SimpleString::~SimpleString(&local_38);
    if (bVar1) break;
    local_28 = MockNamedValueListNode::next(local_28);
  }
  pMVar2 = MockNamedValueListNode::item(local_28);
  return pMVar2;
}

Assistant:

MockNamedValue* MockNamedValueList::getValueByName(const SimpleString& name)
{
    for (MockNamedValueListNode * p = head_; p; p = p->next())
        if (p->getName() == name)
            return p->item();
    return NULLPTR;
}